

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O3

void __thiscall Pager::_open(Pager *this,string *filename)

{
  int __fd;
  ulong uVar1;
  
  __fd = open((filename->_M_dataplus)._M_p,0x42,0x180);
  this->fileDescriptor = __fd;
  if (__fd == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file\n",0x14);
    __fd = this->fileDescriptor;
  }
  uVar1 = lseek(__fd,0,2);
  this->fileLength = (uint32_t)uVar1;
  this->numOfPages = (uint)(uVar1 >> 0xc) & 0xfffff;
  if ((uVar1 & 0xfff) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DB file is corrupt!\n",0x14);
    return;
  }
  return;
}

Assistant:

void Pager::_open(std::string filename) {
	fileDescriptor = open(filename.c_str(), O_RDWR | O_CREAT, S_IRUSR | S_IWUSR);
	if (fileDescriptor == -1) {
		std::cout << "Unable to open file\n";
	}

	fileLength = lseek(fileDescriptor, 0, SEEK_END);
	numOfPages = fileLength / PAGE_SIZE;

	if (fileLength % PAGE_SIZE != 0) {
		std::cout << "DB file is corrupt!\n";
	}
}